

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitReturn
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Return *curr)

{
  array<wasm::Literal,_1UL> *other;
  char *pcVar1;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_88;
  Flow local_68;
  
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                    _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
       0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
  i64 = 0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
  if (curr->value != (Expression *)0x0) {
    visit(&local_68,this,curr->value);
    other = &local_68.values.super_SmallVector<wasm::Literal,_1UL>.fixed;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         local_68.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    Literal::operator=((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                       _M_elems,other->_M_elems);
    local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_68.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_68.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_88);
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         local_68.breakTo.super_IString.str._M_len;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         local_68.breakTo.super_IString.str._M_str;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              (&local_68.values.super_SmallVector<wasm::Literal,_1UL>.flexible);
    Literal::~Literal(other->_M_elems);
    if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) {
      return __return_storage_ptr__;
    }
  }
  pcVar1 = DAT_00da7e20;
  (__return_storage_ptr__->breakTo).super_IString.str._M_len = RETURN_FLOW;
  (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar1;
  return __return_storage_ptr__;
}

Assistant:

Flow visitReturn(Return* curr) {
    NOTE_ENTER("Return");
    Flow flow;
    if (curr->value) {
      flow = visit(curr->value);
      if (flow.breaking()) {
        return flow;
      }
      NOTE_EVAL1(flow.getSingleValue());
    }
    flow.breakTo = RETURN_FLOW;
    return flow;
  }